

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

char * CVmObjFileName::url_to_local(char *str,size_t len,int nullterm)

{
  undefined8 *puVar1;
  long *plVar2;
  int in_EDX;
  size_t buflen;
  err_frame_t err_cur__;
  char *buf;
  char *strz;
  size_t in_stack_fffffffffffffec8;
  void *pvVar3;
  char *in_stack_fffffffffffffed0;
  undefined8 uVar4;
  char *in_stack_fffffffffffffed8;
  uint local_108 [2];
  undefined8 local_100;
  void *local_f8;
  __jmp_buf_tag _Stack_f0;
  char *local_28;
  char *local_20;
  int local_14;
  
  local_20 = (char *)0x0;
  local_28 = (char *)0x0;
  local_14 = in_EDX;
  puVar1 = (undefined8 *)_ZTW11G_err_frame();
  local_100 = *puVar1;
  plVar2 = (long *)_ZTW11G_err_frame();
  *plVar2 = (long)local_108;
  local_108[0] = _setjmp(&_Stack_f0);
  if (local_108[0] == 0) {
    if (local_14 == 0) {
      local_20 = lib_copy_str(in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0);
    }
    local_28 = lib_alloc_str((size_t)in_stack_fffffffffffffed0);
    fn_cvt_url_dir(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(char *)0x2e8fba);
  }
  if (local_108[0] == 1) {
    local_108[0] = 2;
    lib_free_str((char *)0x2e8fd6);
    err_rethrow();
  }
  if ((local_108[0] & 0x8000) == 0) {
    local_108[0] = local_108[0] | 0x8000;
    lib_free_str((char *)0x2e9003);
  }
  uVar4 = local_100;
  puVar1 = (undefined8 *)_ZTW11G_err_frame();
  *puVar1 = uVar4;
  if ((local_108[0] & 0x4001) != 0) {
    puVar1 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar1 & 2) != 0) {
      plVar2 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar2 + 0x10));
    }
    pvVar3 = local_f8;
    plVar2 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar2 + 0x10) = pvVar3;
    err_rethrow();
  }
  if ((local_108[0] & 2) != 0) {
    free(local_f8);
  }
  return local_28;
}

Assistant:

char *CVmObjFileName::url_to_local(
    VMG_ const char *str, size_t len, int nullterm)
{
    char *strz = 0, *buf = 0;
    err_try
    {
        /* 
         *   Estimate the length of the return string we'll need.  Most
         *   systems these days have Unix-like file naming, where the result
         *   path will be the same length as the source path.  There are
         *   older systems with more complex conventions; for example, VMS
         *   puts directories in brackets.  To allow for this kind of
         *   variation, allocate space for the combined string plus some
         *   overhead.  In any case, use the local maximum filename length as
         *   the lower limit.
         */
        size_t buflen = len + 32;
        if (buflen < OSFNMAX)
            buflen = OSFNMAX;
        
        /* make a null-terminated copy of the string if necessary */
        if (!nullterm)
            strz = lib_copy_str(str, len);
        
        /* allocate a conversion buffer */
        buf = lib_alloc_str(buflen);
        
        /* convert the name */
        fn_cvt_url_dir(vmg_ buf, buflen, nullterm ? str : strz);
    }